

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_1::FrontFacingFragmentShader::shadeFragments
          (FrontFacingFragmentShader *this,FragmentPacket *param_1,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  if (0 < numPackets) {
    uVar4 = (uint)(context->visibleFace == FACETYPE_FRONT);
    uVar9 = (int)(uVar4 << 0x1f) >> 0x1f;
    uVar3 = DAT_00a988f0;
    pGVar2 = context->outputArray;
    iVar1 = context->numFragmentOutputs;
    iVar5 = 0;
    uVar6 = 0;
    do {
      lVar7 = 4;
      iVar8 = iVar5;
      do {
        *(ulong *)&pGVar2[iVar8].v =
             ~CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,uVar9) & uVar3 |
             SUB168(ZEXT416(0x3f800000),0) & (ulong)uVar9;
        *(undefined8 *)((long)&pGVar2[iVar8].v + 8) = 0x3f80000000000000;
        iVar8 = iVar8 + iVar1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + iVar1 * 4;
    } while (uVar6 != (uint)numPackets);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* , const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec4 color;
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; ++fragNdx)
			{
				if (context.visibleFace == rr::FACETYPE_FRONT)
					color = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
				else
					color = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			}
		}
	}